

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O1

void Aig_ManDeriveCounterExample(Aig_Man_t *p,Vec_Int_t *vNode2Var,sat_solver *pSat)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  
  iVar1 = p->nObjs[2];
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar5 << 2);
  }
  p_00->pArray = piVar2;
  pVVar3 = p->vCis;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      iVar1 = *(int *)((long)pVVar3->pArray[lVar6] + 0x24);
      if (((long)iVar1 < 0) || (vNode2Var->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_00,vNode2Var->pArray[iVar1]);
      lVar6 = lVar6 + 1;
      pVVar3 = p->vCis;
    } while (lVar6 < pVVar3->nSize);
  }
  piVar2 = p_00->pArray;
  piVar4 = Sat_SolverGetModel(pSat,piVar2,p_00->nSize);
  p->pData = piVar4;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return;
}

Assistant:

void Aig_ManDeriveCounterExample( Aig_Man_t * p, Vec_Int_t * vNode2Var, sat_solver * pSat )
{ 
    Vec_Int_t * vPisIds;
    Aig_Obj_t * pObj;
    int i;
    // collect IDs of PI variables
    // (fanoutless PIs have SAT var 0, which is an unused in the SAT solver -> has value 0)
    vPisIds = Vec_IntAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntPush( vPisIds, Vec_IntEntry(vNode2Var, Aig_ObjId(pObj)) );
    // derive the SAT assignment
    p->pData = Sat_SolverGetModel( pSat, vPisIds->pArray, vPisIds->nSize );
    Vec_IntFree( vPisIds );
}